

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,__1,_int> *this,
          InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *other)

{
  Inverse<Eigen::PermutationMatrix<_1,__1,_int>_> *pIVar1;
  Index IVar2;
  XprTypeNestedCleaned *this_00;
  EigenBase<Eigen::Inverse<Eigen::PermutationMatrix<_1,__1,_int>_>_> *in_RSI;
  StorageIndex i;
  StorageIndex end;
  Scalar *in_stack_ffffffffffffff88;
  EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  undefined4 local_30;
  
  pIVar1 = EigenBase<Eigen::Inverse<Eigen::PermutationMatrix<-1,_-1,_int>_>_>::derived(in_RSI);
  Inverse<Eigen::PermutationMatrix<-1,_-1,_int>_>::nestedExpression(pIVar1);
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x1e1517);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<int,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  IVar2 = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size(in_stack_ffffffffffffff90);
  for (local_30 = 0; local_30 < (int)IVar2; local_30 = local_30 + 1) {
    iVar3 = local_30;
    pIVar1 = EigenBase<Eigen::Inverse<Eigen::PermutationMatrix<-1,_-1,_int>_>_>::derived(in_RSI);
    this_00 = Inverse<Eigen::PermutationMatrix<-1,_-1,_int>_>::nestedExpression(pIVar1);
    PermutationMatrix<-1,_-1,_int>::indices(this_00);
    in_stack_ffffffffffffff90 =
         (EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
         PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff
                   ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
                    in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 =
         PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeffRef
                   ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
                    in_stack_ffffffffffffff90,(Index)in_stack_ffffffffffffff88);
    *in_stack_ffffffffffffff88 = iVar3;
  }
  return;
}

Assistant:

PermutationMatrix(const InverseImpl<Other,PermutationStorage>& other)
      : m_indices(other.derived().nestedExpression().size())
    {
      eigen_internal_assert(m_indices.size() <= NumTraits<StorageIndex>::highest());
      StorageIndex end = StorageIndex(m_indices.size());
      for (StorageIndex i=0; i<end;++i)
        m_indices.coeffRef(other.derived().nestedExpression().indices().coeff(i)) = i;
    }